

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secondaryinstancewidget.cpp
# Opt level: O2

void __thiscall
SecondaryInstanceWidget::SecondaryInstanceWidget
          (SecondaryInstanceWidget *this,KDSingleApplication *kdsa,QWidget *parent)

{
  QLabel *pQVar1;
  QLineEdit *pQVar2;
  QPushButton *this_00;
  QGridLayout *this_01;
  undefined4 *puVar3;
  undefined8 in_stack_ffffffffffffff88;
  uint uVar5;
  ulong uVar4;
  QArrayDataPointer<char16_t> local_58;
  Object local_40 [8];
  QObject local_38 [8];
  Object local_30 [8];
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00108b00;
  *(undefined ***)&this->field_0x10 = &PTR__SecondaryInstanceWidget_00108cb0;
  this->m_kdsa = kdsa;
  this->m_messageEdit = (QLineEdit *)0x0;
  tr((QString *)&local_58,"Secondary instance",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar1 = (QLabel *)operator_new(0x28);
  tr((QString *)&local_58,"<b>Secondary instance.</b> Send message to primary:",(char *)0x0,-1);
  QLabel::QLabel(pQVar1,&local_58,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar2 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar2,(QWidget *)0x0);
  this->m_messageEdit = pQVar2;
  tr((QString *)&local_58,"Type something here...",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  this_00 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_58,"&Send",(char *)0x0,-1);
  QPushButton::QPushButton(this_00,(QString *)&local_58,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  this_01 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_01,(QWidget *)0x0);
  QGridLayout::addWidget(this_01,pQVar1,0,0,1,2,(ulong)uVar5 << 0x20);
  QGridLayout::addWidget(this_01,this->m_messageEdit,1,0,0);
  QGridLayout::addWidget(this_01,this_00,1,1,0);
  QWidget::setLayout((QLayout *)this);
  local_58.d = (Data *)sendMessage;
  local_58.ptr = (char16_t *)0x0;
  uVar4 = 0;
  QObject::connect<void(QLineEdit::*)(),void(SecondaryInstanceWidget::*)()>
            (local_30,(offset_in_QLineEdit_to_subr)this->m_messageEdit,
             (Object *)QLineEdit::returnPressed,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  pQVar2 = this->m_messageEdit;
  local_58.d = (Data *)QLineEdit::textChanged;
  local_58.ptr = (char16_t *)0x0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDSingleApplication/examples/widgetsingleapplication/secondaryinstancewidget.cpp:42:19),_1,_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QPushButton **)(puVar3 + 4) = this_00;
  QObject::connectImpl
            (local_38,(void **)pQVar2,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)(uVar4 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_58.d = (Data *)sendMessage;
  local_58.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(SecondaryInstanceWidget::*)()>
            (local_40,(offset_in_QAbstractButton_to_subr)this_00,(Object *)QAbstractButton::clicked,
             0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

SecondaryInstanceWidget::SecondaryInstanceWidget(KDSingleApplication *kdsa, QWidget *parent)
    : QWidget(parent)
    , m_kdsa(kdsa)
{
    setWindowTitle(tr("Secondary instance"));
    QLabel *label = new QLabel(tr("<b>Secondary instance.</b> Send message to primary:"));
    m_messageEdit = new QLineEdit;
    m_messageEdit->setPlaceholderText(tr("Type something here..."));

    QPushButton *sendButton = new QPushButton(tr("&Send"));

    QGridLayout *layout = new QGridLayout;
    layout->addWidget(label, 0, 0, 1, 2);
    layout->addWidget(m_messageEdit, 1, 0);
    layout->addWidget(sendButton, 1, 1);

    setLayout(layout);

    connect(m_messageEdit, &QLineEdit::returnPressed, this, &SecondaryInstanceWidget::sendMessage);
    connect(m_messageEdit, &QLineEdit::textChanged,
            this, [sendButton](const QString &text) { sendButton->setEnabled(!text.isEmpty()); });
    connect(sendButton, &QPushButton::clicked, this, &SecondaryInstanceWidget::sendMessage);
}